

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_error(char *json,int domain,bson_json_error_code_t code)

{
  size_t sVar1;
  long lVar2;
  bson_t *bson;
  bson_error_t error;
  bson_json_error_code_t code_local;
  int domain_local;
  char *json_local;
  
  error.message._496_4_ = code;
  error.message._500_4_ = domain;
  sVar1 = strlen(json);
  lVar2 = bson_new_from_json(json,sVar1,&bson);
  if (lVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x527,"test_bson_json_error","!bson");
    abort();
  }
  if ((int)bson != error.message._500_4_) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x528,"test_bson_json_error","error.domain == domain");
    abort();
  }
  if (bson._4_4_ != error.message._496_4_) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x529,"test_bson_json_error","error.code == code");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_json_error (const char *json, int domain, bson_json_error_code_t code)
{
   bson_error_t error;
   bson_t *bson;

   bson = bson_new_from_json ((const uint8_t *) json, strlen (json), &error);

   BSON_ASSERT (!bson);
   BSON_ASSERT (error.domain == domain);
   BSON_ASSERT (error.code == code);
}